

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshproxy.c
# Opt level: O3

size_t sshproxy_output(Seat *seat,SeatOutputType type,void *data,size_t len)

{
  size_t sVar1;
  
  if (type == SEAT_OUTPUT_STDERR) {
    log_proxy_stderr((Plug *)seat[-0xc].vt,(ProxyStderrBuf *)(seat + -0x40d),data,len);
  }
  else if (type == SEAT_OUTPUT_STDOUT) {
    bufchain_add((bufchain *)(seat + -10),data,len);
    try_send_ssh_to_socket(seat + -0x416);
  }
  sVar1 = bufchain_size((bufchain *)(seat + -10));
  return sVar1;
}

Assistant:

static size_t sshproxy_output(Seat *seat, SeatOutputType type,
                              const void *data, size_t len)
{
    SshProxy *sp = container_of(seat, SshProxy, seat);
    switch (type) {
      case SEAT_OUTPUT_STDOUT:
        bufchain_add(&sp->ssh_to_socket, data, len);
        try_send_ssh_to_socket(sp);
        break;
      case SEAT_OUTPUT_STDERR:
        log_proxy_stderr(sp->plug, &sp->psb, data, len);
        break;
    }
    return bufchain_size(&sp->ssh_to_socket);
}